

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O3

void __thiscall
absl::lts_20240722::container_internal::HashSetResizeHelper::DeallocateOld<8ul,std::allocator<char>>
          (HashSetResizeHelper *this,allocator<char> *param_2,long param_3)

{
  RawHashSetLayout layout;
  RawHashSetLayout local_38;
  
  if (this->was_soo_ == true) {
    __assert_fail("!was_soo_",
                  "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                  ,0x7c2,"void *absl::container_internal::HashSetResizeHelper::old_slots() const");
  }
  RawHashSetLayout::RawHashSetLayout(&local_38,this->old_capacity_,8,this->had_infoz_);
  if (this->was_soo_ != true) {
    Deallocate<8ul,std::allocator<char>>
              (param_2,(this->old_heap_or_soo_).heap.control + -local_38.control_offset_,
               param_3 * local_38.capacity_ + local_38.slot_offset_);
    return;
  }
  __assert_fail("!was_soo_",
                "/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                ,0x7be,"ctrl_t *absl::container_internal::HashSetResizeHelper::old_ctrl() const");
}

Assistant:

void* old_slots() const {
    assert(!was_soo_);
    return old_heap_or_soo_.slot_array().get();
  }